

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O2

void __thiscall QInputDialogPrivate::ensureListView(QInputDialogPrivate *this)

{
  QWidget *parent;
  QInputDialogListView *pQVar1;
  QWidget *this_00;
  QAbstractItemModel *pQVar2;
  QItemSelectionModel *signal;
  long in_FS_OFFSET;
  Object local_40 [8];
  code *local_38;
  quintptr qStack_30;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tStack_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->listView == (QInputDialogListView *)0x0) {
    parent = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
    ensureComboBox(this);
    this_00 = (QWidget *)operator_new(0x28);
    QInputDialogListView::QInputDialogListView((QInputDialogListView *)this_00,parent);
    this->listView = (QInputDialogListView *)this_00;
    QWidget::hide(this_00);
    QAbstractItemView::setEditTriggers((QAbstractItemView *)this->listView,(EditTriggers)0x0);
    QAbstractItemView::setSelectionMode((QAbstractItemView *)this->listView,SingleSelection);
    pQVar1 = this->listView;
    pQVar2 = QComboBox::model(this->comboBox);
    (**(code **)(*(long *)&(pQVar1->super_QListView).super_QAbstractItemView.
                           super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x1c8))
              (pQVar1,pQVar2);
    local_38 = (code *)0xffffffffffffffff;
    qStack_30 = 0;
    tStack_28.ptr = (QAbstractItemModel *)0x0;
    QAbstractItemView::setCurrentIndex((QAbstractItemView *)this->listView,(QModelIndex *)&local_38)
    ;
    signal = QAbstractItemView::selectionModel((QAbstractItemView *)this->listView);
    local_38 = currentRowChanged;
    qStack_30 = 0;
    QObjectPrivate::
    connect<void(QItemSelectionModel::*)(QModelIndex_const&,QModelIndex_const&),void(QInputDialogPrivate::*)(QModelIndex_const&,QModelIndex_const&)>
              (local_40,(offset_in_QItemSelectionModel_to_subr)signal,
               (Object *)QItemSelectionModel::currentRowChanged,0,(ConnectionType)this);
    QMetaObject::Connection::~Connection((Connection *)local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QInputDialogPrivate::ensureListView()
{
    Q_Q(QInputDialog);
    if (!listView) {
        ensureComboBox();
        listView = new QInputDialogListView(q);
        listView->hide();
        listView->setEditTriggers(QAbstractItemView::NoEditTriggers);
        listView->setSelectionMode(QAbstractItemView::SingleSelection);
        listView->setModel(comboBox->model());
        listView->setCurrentIndex(QModelIndex()); // ###
        QObjectPrivate::connect(listView->selectionModel(),
                                &QItemSelectionModel::currentRowChanged,
                                this, &QInputDialogPrivate::currentRowChanged);
    }
}